

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz.h
# Opt level: O3

ZZ<130UL> * __thiscall GF2::ZZ<130UL>::operator-=(ZZ<130UL> *this,ZZ<130UL> *zRight)

{
  word *pwVar1;
  size_t pos;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  lVar2 = 0;
  uVar3 = 0;
  do {
    uVar5 = (this->super_WW<130UL>)._words[lVar2] - uVar3;
    (this->super_WW<130UL>)._words[lVar2] = uVar5;
    uVar4 = uVar5 - (zRight->super_WW<130UL>)._words[lVar2];
    (this->super_WW<130UL>)._words[lVar2] = uVar4;
    if (!CARRY8(uVar5,uVar3)) {
      uVar3 = (ulong)CARRY8(uVar4,(zRight->super_WW<130UL>)._words[lVar2]);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  pwVar1 = (this->super_WW<130UL>)._words + 2;
  *pwVar1 = *pwVar1 & 3;
  return this;
}

Assistant:

ZZ& operator-=(const ZZ& zRight)
	{	
		word borrow = 0;
		for (size_t pos = 0; pos < _wcount; pos++)
			if ((_words[pos] -= borrow) > WORD_MAX - borrow) 
				_words[pos] -= zRight.GetWord(pos);
            else 
				borrow = (_words[pos] -= zRight.GetWord(pos)) > 
					WORD_MAX - zRight.GetWord(pos);
		Trim();
		return *this;
	}